

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bdestroy(bstring b)

{
  int iVar1;
  int iVar2;
  
  iVar1 = -1;
  iVar2 = -1;
  if ((((b != (bstring)0x0) && (iVar2 = iVar1, -1 < b->slen)) && (b->slen <= b->mlen && 0 < b->mlen)
      ) && (b->data != (uchar *)0x0)) {
    free(b->data);
    free(b);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int bdestroy (bstring b) {
	if (b == NULL || b->slen < 0 || b->mlen <= 0 || b->mlen < b->slen ||
	    b->data == NULL)
		return BSTR_ERR;

	bstr__free (b->data);

	/* In case there is any stale usage, there is one more chance to 
	   notice this error. */

	b->slen = -1;
	b->mlen = -__LINE__;
	b->data = NULL;

	bstr__free (b);
	return 0;
}